

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::anon_unknown_0::SourceInfoTest::HasSpanWithComment
          (SourceInfoTest *this,char start_marker,char end_marker,Message *descriptor_proto,
          FieldDescriptor *field,int index,char *expected_leading_comments,
          char *expected_trailing_comments,char *expected_leading_detached_comments)

{
  flat_hash_map<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  *c;
  SooRep *this_00;
  int value;
  int value_00;
  size_t c_00;
  long lVar1;
  long *plVar2;
  FieldOptions *pFVar3;
  FileDescriptor **ppFVar4;
  long *plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  reference key_00;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>_>
  ppVar13;
  const_reference piVar14;
  ctrl_t *pcVar15;
  anon_union_8_1_a8a14541_for_iterator_2 aVar16;
  pointer *__ptr;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar17;
  undefined4 in_register_0000008c;
  long *__dest;
  bool bVar18;
  string_view separator;
  RepeatedField<int> expected_span;
  SpanKey key;
  undefined1 local_c8 [8];
  anon_union_8_1_a8a14541_for_iterator_2 local_c0;
  byte local_b3;
  char local_b2;
  char local_b1;
  undefined1 local_b0;
  bool bStack_af;
  undefined6 uStack_ae;
  anon_union_8_1_a8a14541_for_iterator_2 local_a8;
  FileDescriptor *pFStack_a0;
  once_flag *local_98;
  Descriptor *pDStack_90;
  anon_union_8_2_2904990b_for_scope_ local_88;
  anon_union_8_2_3066aaf9_for_type_descriptor_ aStack_80;
  iterator local_78;
  iterator local_68;
  anon_union_8_1_a8a14541_for_iterator_2 local_58;
  AssertHelper local_50;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_48;
  FieldOptions *pFStack_40;
  int local_38;
  undefined4 uStack_34;
  
  c = &this->spans_;
  local_b2 = end_marker;
  local_b1 = start_marker;
  local_48 = (anon_union_8_2_3066aaf9_for_type_descriptor_)descriptor_proto;
  pFStack_40 = (FieldOptions *)field;
  local_38 = index;
  if (start_marker != '\0') {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
    ::
    find_or_prepare_insert<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>::iterator,_bool>
                *)&local_b0,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                *)c,(SpanKey *)&local_48);
    aVar16 = local_a8;
    if (pFStack_a0._0_1_ == true) {
      pFVar3 = (FieldOptions *)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
      local_68.field_1.slot_ = local_a8.slot_;
      local_68.ctrl_ = (ctrl_t *)pFVar3;
      c_00 = (c->
             super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
             ).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
             .settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
      (c->
      super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
      ).
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 0xffffffffffffff9c;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_a8.slot_ + 0x10))->_M_allocated_capacity = CONCAT44(uStack_34,local_38);
      *(anon_union_8_2_3066aaf9_for_type_descriptor_ *)local_a8.slot_ = local_48;
      *(FieldOptions **)((long)local_a8.slot_ + 8) = pFStack_40;
      *(undefined8 *)((long)local_a8.slot_ + 0x18) = 0;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_a8.slot_ + 0x20))->_M_dataplus)._M_p = (pointer)0x0;
      *(size_type *)((long)local_a8.slot_ + 0x28) = 0;
      absl::lts_20250127::container_internal::CommonFields::set_capacity((CommonFields *)c,c_00);
      key_00 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
               ::iterator::operator*(&local_68);
      _local_c8 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                  ::find<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
                            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                              *)c,&key_00->first);
      local_78.field_1.slot_ = (slot_type *)aVar16;
      local_78.ctrl_ = (ctrl_t *)pFVar3;
      bVar8 = absl::lts_20250127::container_internal::operator==((iterator *)local_c8,&local_78);
      if (!bVar8) goto LAB_00ab3f10;
    }
    local_58.slot_ = (slot_type *)local_a8;
    ppVar13 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
              ::
              at<char,absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                          *)&this->markers_,&local_b1);
    iVar10 = ppVar13->first;
    iVar11 = ppVar13->second;
    ppVar13 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
              ::
              at<char,absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                          *)&this->markers_,&local_b2);
    value = ppVar13->first;
    value_00 = ppVar13->second;
    local_68 = (iterator)ZEXT816(0);
    RepeatedField<int>::Add((RepeatedField<int> *)&local_68,iVar10);
    RepeatedField<int>::Add((RepeatedField<int> *)&local_68,iVar11);
    if (value != iVar10) {
      RepeatedField<int>::Add((RepeatedField<int> *)&local_68,value);
    }
    RepeatedField<int>::Add((RepeatedField<int> *)&local_68,value_00);
    for (__dest = *(long **)((long)local_58.slot_ + 0x18);
        local_b3 = __dest != (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)local_58.slot_ + 0x20))->_M_dataplus)._M_p,
        (bool)local_b3; __dest = __dest + 1) {
      lVar1 = *__dest;
      iVar10 = protobuf::internal::SooRep::size
                         ((SooRep *)&local_68,
                          ((undefined1  [16])local_68 & (undefined1  [16])0x4) ==
                          (undefined1  [16])0x0);
      this_00 = (SooRep *)(lVar1 + 0x30);
      iVar11 = protobuf::internal::SooRep::size
                         (this_00,(undefined1  [16])
                                  ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                                  (undefined1  [16])0x0);
      if (iVar10 == iVar11) {
        iVar10 = protobuf::internal::SooRep::size
                           ((SooRep *)&local_68,
                            ((undefined1  [16])local_68 & (undefined1  [16])0x4) ==
                            (undefined1  [16])0x0);
        bVar8 = iVar10 < 1;
        if (0 < iVar10) {
          iVar10 = 0;
          do {
            piVar14 = RepeatedField<int>::Get((RepeatedField<int> *)&local_68,iVar10);
            iVar11 = *piVar14;
            piVar14 = RepeatedField<int>::Get((RepeatedField<int> *)this_00,iVar10);
            if (iVar11 != *piVar14) break;
            iVar11 = protobuf::internal::SooRep::size
                               ((SooRep *)&local_68,
                                ((undefined1  [16])local_68 & (undefined1  [16])0x4) ==
                                (undefined1  [16])0x0);
            iVar10 = iVar10 + 1;
            bVar8 = iVar11 <= iVar10;
          } while (iVar10 < iVar11);
        }
      }
      else {
        bVar8 = false;
      }
      if (bVar8) {
        if (expected_leading_comments == (char *)0x0) {
          uVar12 = *(uint *)(lVar1 + 0x10) & 1;
          local_c8[0] = (internal)((byte)uVar12 ^ 1);
          local_c0.slot_ = (slot_type *)0x0;
          if (uVar12 != 0) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_b0,(internal *)local_c8,
                       (AssertionResult *)"location->has_leading_comments()","true","false",
                       (char *)CONCAT44(in_register_0000008c,index));
            field = (FieldDescriptor *)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc8f,(char *)field);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            ppFVar4 = (FileDescriptor **)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
            if (ppFVar4 != &pFStack_a0) {
              operator_delete(ppFVar4,(ulong)&pFStack_a0->is_placeholder_);
            }
            if ((FieldOptions *)local_78.ctrl_ != (FieldOptions *)0x0) {
              (*(((Message *)local_78.ctrl_)->super_MessageLite)._vptr_MessageLite[1])();
            }
          }
          if (local_c0.slot_ != (slot_type *)0x0) {
            paVar17 = &local_c0;
            aVar16 = local_c0;
            goto LAB_00ab39f9;
          }
        }
        else {
          bVar9 = *(byte *)(lVar1 + 0x10) & 1;
          local_c8[0] = (internal)bVar9;
          local_c0.slot_ = (slot_type *)0x0;
          if (bVar9 == 0) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_b0,(internal *)local_c8,
                       (AssertionResult *)"location->has_leading_comments()","false","true",
                       (char *)CONCAT44(in_register_0000008c,index));
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc91,(char *)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0)));
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            ppFVar4 = (FileDescriptor **)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
            if (ppFVar4 != &pFStack_a0) {
              operator_delete(ppFVar4,(ulong)&pFStack_a0->is_placeholder_);
            }
            if ((FieldOptions *)local_78.ctrl_ != (FieldOptions *)0x0) {
              (*(((Message *)local_78.ctrl_)->super_MessageLite)._vptr_MessageLite[1])();
            }
          }
          if (local_c0.slot_ != (slot_type *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0.slot_);
          }
          field = (FieldDescriptor *)(*(ulong *)(lVar1 + 0x60) & 0xfffffffffffffffc);
          testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                    ((internal *)&local_b0,"expected_leading_comments",
                     "location->leading_comments()",&expected_leading_comments,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
          if (local_b0 == '\0') {
            testing::Message::Message((Message *)local_c8);
            field = (FieldDescriptor *)(anon_var_dwarf_a12c75 + 5);
            if (local_a8.slot_ != (slot_type *)0x0) {
              field = *(FieldDescriptor **)local_a8.slot_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc92,(char *)field);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_78,(Message *)local_c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
            if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                 )local_c8 !=
                (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(undefined8 *)local_c8 + 8))();
            }
          }
          if (local_a8.slot_ != (slot_type *)0x0) {
            paVar17 = &local_a8;
            aVar16 = local_a8;
LAB_00ab39f9:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)paVar17,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         aVar16.slot_);
          }
        }
        if (expected_trailing_comments == (char *)0x0) {
          bVar18 = (*(byte *)(lVar1 + 0x10) & 2) == 0;
          local_c8[0] = (internal)bVar18;
          local_c0.slot_ = (slot_type *)0x0;
          if (!bVar18) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_b0,(internal *)local_c8,
                       (AssertionResult *)"location->has_trailing_comments()","true","false",
                       (char *)CONCAT44(in_register_0000008c,index));
            field = (FieldDescriptor *)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc95,(char *)field);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            ppFVar4 = (FileDescriptor **)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
            if (ppFVar4 != &pFStack_a0) {
              operator_delete(ppFVar4,(ulong)&pFStack_a0->is_placeholder_);
            }
            if ((FieldOptions *)local_78.ctrl_ != (FieldOptions *)0x0) {
              (*(((Message *)local_78.ctrl_)->super_MessageLite)._vptr_MessageLite[1])();
            }
          }
          if (local_c0.slot_ != (slot_type *)0x0) {
            paVar17 = &local_c0;
            aVar16 = local_c0;
            goto LAB_00ab3c10;
          }
        }
        else {
          uVar12 = *(uint *)(lVar1 + 0x10) & 2;
          local_c8[0] = (internal)(char)(uVar12 >> 1);
          local_c0.slot_ = (slot_type *)0x0;
          if (uVar12 == 0) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_b0,(internal *)local_c8,
                       (AssertionResult *)"location->has_trailing_comments()","false","true",
                       (char *)CONCAT44(in_register_0000008c,index));
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc97,(char *)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0)));
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            ppFVar4 = (FileDescriptor **)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
            if (ppFVar4 != &pFStack_a0) {
              operator_delete(ppFVar4,(ulong)&pFStack_a0->is_placeholder_);
            }
            if ((FieldOptions *)local_78.ctrl_ != (FieldOptions *)0x0) {
              (*(((Message *)local_78.ctrl_)->super_MessageLite)._vptr_MessageLite[1])();
            }
          }
          if (local_c0.slot_ != (slot_type *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0.slot_);
          }
          field = (FieldDescriptor *)(*(ulong *)(lVar1 + 0x68) & 0xfffffffffffffffc);
          testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                    ((internal *)&local_b0,"expected_trailing_comments",
                     "location->trailing_comments()",&expected_trailing_comments,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
          if (local_b0 == '\0') {
            testing::Message::Message((Message *)local_c8);
            field = (FieldDescriptor *)(anon_var_dwarf_a12c75 + 5);
            if (local_a8.slot_ != (slot_type *)0x0) {
              field = *(FieldDescriptor **)local_a8.slot_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc98,(char *)field);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_78,(Message *)local_c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
            if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                 )local_c8 !=
                (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(undefined8 *)local_c8 + 8))();
            }
          }
          if (local_a8.slot_ != (slot_type *)0x0) {
            paVar17 = &local_a8;
            aVar16 = local_a8;
LAB_00ab3c10:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)paVar17,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         aVar16.slot_);
          }
        }
        if (expected_leading_detached_comments == (char *)0x0) {
          auVar6._12_4_ = 0;
          auVar6._0_12_ = stack0xffffffffffffff3c;
          _local_c8 = (iterator)(auVar6 << 0x20);
          local_78.ctrl_ = (ctrl_t *)CONCAT44(local_78.ctrl_._4_4_,*(undefined4 *)(lVar1 + 0x50));
          field = (FieldDescriptor *)&local_78;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_b0,"0","location->leading_detached_comments_size()",
                     (int *)local_c8,(int *)&local_78);
          if (local_b0 == '\0') {
            testing::Message::Message((Message *)local_c8);
            field = (FieldDescriptor *)(anon_var_dwarf_a12c75 + 5);
            if (local_a8.slot_ != (slot_type *)0x0) {
              field = *(FieldDescriptor **)local_a8.slot_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc9b,(char *)field);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_78,(Message *)local_c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
            if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                 )local_c8 !=
                (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(undefined8 *)local_c8 + 8))();
            }
          }
          if (local_a8.slot_ != (slot_type *)0x0) {
            paVar17 = &local_a8;
            aVar16 = local_a8;
            goto LAB_00ab3d8b;
          }
        }
        else {
          separator._M_str = (char *)field;
          separator._M_len = (size_t)"\n";
          absl::lts_20250127::strings_internal::
          JoinRange<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                    ((string *)&local_b0,(strings_internal *)(lVar1 + 0x48),
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1,separator);
          field = (FieldDescriptor *)&local_b0;
          testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                    ((internal *)local_c8,"expected_leading_detached_comments",
                     "absl::StrJoin(location->leading_detached_comments(), \"\\n\")",
                     &expected_leading_detached_comments,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0)
          ;
          ppFVar4 = (FileDescriptor **)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
          if (ppFVar4 != &pFStack_a0) {
            operator_delete(ppFVar4,(ulong)&pFStack_a0->is_placeholder_);
          }
          if (local_c8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_b0);
            field = (FieldDescriptor *)(anon_var_dwarf_a12c75 + 5);
            if (local_c0.slot_ != (slot_type *)0x0) {
              field = *(FieldDescriptor **)local_c0.slot_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc9e,(char *)field);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_78,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
            plVar5 = (long *)CONCAT62(uStack_ae,CONCAT11(bStack_af,local_b0));
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
          }
          if (local_c0.slot_ != (slot_type *)0x0) {
            paVar17 = &local_c0;
            aVar16 = local_c0;
LAB_00ab3d8b:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)paVar17,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         aVar16.slot_);
          }
        }
        plVar5 = __dest + 1;
        plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)local_58.slot_ + 0x20))->_M_dataplus)._M_p;
        if (plVar5 != plVar2) {
          memmove(__dest,plVar5,(long)plVar2 - (long)plVar5);
        }
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)local_58.slot_ + 0x20))->_M_dataplus)._M_p =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)local_58.slot_ + 0x20))->_M_dataplus)._M_p + -8;
        if (bVar8) break;
      }
    }
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)&local_68);
    bVar9 = local_b3;
    goto LAB_00ab3eea;
  }
  local_68 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
             ::find<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                         *)c,(key_arg<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
                              *)&local_48);
  aVar16 = local_68.field_1;
  pcVar15 = local_68.ctrl_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
              *)c);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_c0;
  _local_c8 = (iterator)(auVar7 << 0x40);
  bVar8 = absl::lts_20250127::container_internal::operator==(&local_68,(iterator *)local_c8);
  if (bVar8) {
    bStack_af = false;
    local_a8.slot_ = (slot_type *)0x0;
    pFStack_a0 = (FileDescriptor *)0x0;
    local_98 = (once_flag *)0x0;
    pDStack_90 = (Descriptor *)0x0;
    local_88.containing_oneof = (OneofDescriptor *)0x0;
    aStack_80.message_type = (Descriptor *)0x0;
LAB_00ab3ed2:
    bVar9 = pDStack_90 != (Descriptor *)local_88.containing_oneof & bStack_af;
    absl::lts_20250127::container_internal::
    node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
    ::~node_handle_base((node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                         *)&local_b0);
LAB_00ab3eea:
    return (bool)(bVar9 & 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
              *)c);
  if (pcVar15 == (ctrl_t *)0x0) {
    compiler::_GLOBAL__N_1::SourceInfoTest::HasSpanWithComment();
LAB_00ab3f06:
    compiler::_GLOBAL__N_1::SourceInfoTest::HasSpanWithComment();
  }
  else {
    if (pcVar15 == absl::lts_20250127::container_internal::kEmptyGroup + 0x10) goto LAB_00ab3f06;
    if (kSentinel < *pcVar15) {
      bStack_af = true;
      local_a8 = *(anon_union_8_1_a8a14541_for_iterator_2 *)aVar16.slot_;
      pFStack_a0 = *(FileDescriptor **)((long)aVar16.slot_ + 8);
      local_98 = *(once_flag **)((long)aVar16.slot_ + 0x10);
      pDStack_90 = *(Descriptor **)((long)aVar16.slot_ + 0x18);
      local_88 = (anon_union_8_2_2904990b_for_scope_)
                 ((anon_union_8_2_2904990b_for_scope_ *)((long)aVar16.slot_ + 0x20))->
                 containing_oneof;
      aStack_80 = *(anon_union_8_2_3066aaf9_for_type_descriptor_ *)((long)aVar16.slot_ + 0x28);
      *(undefined8 *)((long)aVar16.slot_ + 0x28) = 0;
      *(undefined8 *)((long)aVar16.slot_ + 0x18) = 0;
      *(undefined8 *)((long)aVar16.slot_ + 0x20) = 0;
      absl::lts_20250127::container_internal::EraseMetaOnly
                ((CommonFields *)c,
                 (long)pcVar15 -
                 (long)(this->spans_).
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_.heap.control,0x30);
      goto LAB_00ab3ed2;
    }
  }
  compiler::_GLOBAL__N_1::SourceInfoTest::HasSpanWithComment();
LAB_00ab3f10:
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>, absl::hash_internal::Hash<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, std::equal_to<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, std::allocator<std::pair<const google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>, Hash = absl::hash_internal::Hash<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, Eq = std::equal_to<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, Alloc = std::allocator<std::pair<const google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>>, Args = <const std::piecewise_construct_t &, std::tuple<const google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey &>, std::tuple<>>]"
               );
}

Assistant:

bool HasSpanWithComment(char start_marker, char end_marker,
                          const Message& descriptor_proto,
                          const FieldDescriptor* field, int index,
                          const char* expected_leading_comments,
                          const char* expected_trailing_comments,
                          const char* expected_leading_detached_comments) {
    SpanKey key(descriptor_proto, field, index);
    if (start_marker == '\0') {
      auto old = spans_.extract(key);
      // Return true if we actually removed something.
      return !(old.empty() || old.mapped().empty());
    }

    std::vector<const SourceCodeInfo::Location*>& range = spans_[key];
    std::pair<int, int> start_pos = markers_.at(start_marker);
    std::pair<int, int> end_pos = markers_.at(end_marker);

    RepeatedField<int> expected_span;
    expected_span.Add(start_pos.first);
    expected_span.Add(start_pos.second);
    if (end_pos.first != start_pos.first) {
      expected_span.Add(end_pos.first);
    }
    expected_span.Add(end_pos.second);

    for (auto iter = range.begin(); iter != range.end(); ++iter) {
      const SourceCodeInfo::Location* location = *iter;
      if (CompareSpans(expected_span, location->span())) {
        if (expected_leading_comments == nullptr) {
          EXPECT_FALSE(location->has_leading_comments());
        } else {
          EXPECT_TRUE(location->has_leading_comments());
          EXPECT_EQ(expected_leading_comments, location->leading_comments());
        }
        if (expected_trailing_comments == nullptr) {
          EXPECT_FALSE(location->has_trailing_comments());
        } else {
          EXPECT_TRUE(location->has_trailing_comments());
          EXPECT_EQ(expected_trailing_comments, location->trailing_comments());
        }
        if (expected_leading_detached_comments == nullptr) {
          EXPECT_EQ(0, location->leading_detached_comments_size());
        } else {
          EXPECT_EQ(expected_leading_detached_comments,
                    absl::StrJoin(location->leading_detached_comments(), "\n"));
        }
        range.erase(iter);
        return true;
      }
    }

    return false;
  }